

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O2

int Shr_ObjPerformBidec(Shr_Man_t *p,Bdc_Man_t *pManDec,Gia_Man_t *pNew,Vec_Int_t *vLeafLits,
                       word uTruth1,word uTruthC)

{
  int iVar1;
  int iVar2;
  int iLit1;
  uint uVar3;
  Bdc_Fun_t *pBVar4;
  Bdc_Fun_t *pBVar5;
  Gia_Obj_t *pObj;
  int iVar6;
  int iVar7;
  word uTruthC_local;
  word uTruth1_local;
  
  uTruthC_local = uTruthC;
  uTruth1_local = uTruth1;
  if ((uTruth1 == 0) || (uTruthC == 0)) {
    __assert_fail("uTruth1 != 0 && uTruthC != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                  ,0x119,
                  "int Shr_ObjPerformBidec(Shr_Man_t *, Bdc_Man_t *, Gia_Man_t *, Vec_Int_t *, word, word)"
                 );
  }
  iVar6 = vLeafLits->nSize;
  iVar7 = 0;
  Bdc_ManDecompose(pManDec,(uint *)&uTruth1_local,(uint *)&uTruthC_local,iVar6,(Vec_Ptr_t *)0x0,1000
                  );
  pBVar4 = Bdc_ManFunc(pManDec,0);
  iVar1 = 1;
  while( true ) {
    Bdc_FuncSetCopyInt(pBVar4,iVar1);
    if (vLeafLits->nSize <= iVar7) break;
    iVar1 = Vec_IntEntry(vLeafLits,iVar7);
    iVar7 = iVar7 + 1;
    pBVar4 = Bdc_ManFunc(pManDec,iVar7);
    if (iVar1 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    iVar1 = iVar1 * 2;
  }
  iVar1 = Bdc_ManNodeNum(pManDec);
  do {
    do {
      iVar6 = iVar6 + 1;
      if (iVar1 <= iVar6) {
        pBVar4 = Bdc_ManRoot(pManDec);
        iVar6 = Bdc_FunObjCopy(pBVar4);
        return iVar6;
      }
      pBVar4 = Bdc_ManFunc(pManDec,iVar6);
      iVar7 = pNew->nObjs;
      pBVar5 = Bdc_FuncFanin0(pBVar4);
      iVar2 = Bdc_FunObjCopy(pBVar5);
      pBVar5 = Bdc_FuncFanin1(pBVar4);
      iLit1 = Bdc_FunObjCopy(pBVar5);
      iVar2 = Gia_ManHashAnd(pNew,iVar2,iLit1);
      Bdc_FuncSetCopyInt(pBVar4,iVar2);
    } while (iVar7 == pNew->nObjs);
    if (iVar7 + 1 != pNew->nObjs) {
      __assert_fail("iLast + 1 == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                    ,0x127,
                    "int Shr_ObjPerformBidec(Shr_Man_t *, Bdc_Man_t *, Gia_Man_t *, Vec_Int_t *, word, word)"
                   );
    }
    iVar7 = Abc_Lit2Var(iVar2);
    pObj = Gia_ManObj(pNew,iVar7);
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar3 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar3 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x242,"void Gia_ObjSetAndLevel(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar7 = Gia_ObjLevel(pNew,pObj + -(ulong)uVar3);
    iVar2 = Gia_ObjLevel(pNew,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    if (iVar7 <= iVar2) {
      iVar7 = iVar2;
    }
    Gia_ObjSetLevel(pNew,pObj,iVar7 + 1);
    iVar7 = Gia_ObjFaninId0p(pNew,pObj);
    iVar2 = Gia_ObjId(pNew,pObj);
    Shr_ManAddFanout(p,iVar7,iVar2);
    iVar7 = Gia_ObjFaninId1p(pNew,pObj);
    iVar2 = Gia_ObjId(pNew,pObj);
    Shr_ManAddFanout(p,iVar7,iVar2);
  } while (pNew->nObjs < p->nNewSize);
  __assert_fail("Gia_ManObjNum(pNew) < p->nNewSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                ,300,
                "int Shr_ObjPerformBidec(Shr_Man_t *, Bdc_Man_t *, Gia_Man_t *, Vec_Int_t *, word, word)"
               );
}

Assistant:

int Shr_ObjPerformBidec( Shr_Man_t * p, Bdc_Man_t * pManDec, Gia_Man_t * pNew, Vec_Int_t * vLeafLits, word uTruth1, word uTruthC )
{
    Bdc_Fun_t * pFunc;
    Gia_Obj_t * pObj;
    int i, iVar, iLit, nNodes, iLast;
    int nVars = Vec_IntSize(vLeafLits);
    assert( uTruth1 != 0 && uTruthC != 0 );
    Bdc_ManDecompose( pManDec, (unsigned *)&uTruth1, (unsigned *)&uTruthC, nVars, NULL, 1000 );
    Bdc_FuncSetCopyInt( Bdc_ManFunc(pManDec, 0), 1 );
    Vec_IntForEachEntry( vLeafLits, iVar, i )
        Bdc_FuncSetCopyInt( Bdc_ManFunc(pManDec, i+1), Abc_Var2Lit(iVar, 0) );
    nNodes = Bdc_ManNodeNum( pManDec );
    for ( i = nVars + 1; i < nNodes; i++ )
    {
        pFunc = Bdc_ManFunc( pManDec, i );
        iLast = Gia_ManObjNum(pNew);
        iLit  = Gia_ManHashAnd( pNew, Bdc_FunFanin0Copy(pFunc), Bdc_FunFanin1Copy(pFunc) );
        Bdc_FuncSetCopyInt( pFunc, iLit );
        if ( iLast == Gia_ManObjNum(pNew) )
            continue;
        assert( iLast + 1 == Gia_ManObjNum(pNew) );
        pObj = Gia_ManObj(pNew, Abc_Lit2Var(iLit));
        Gia_ObjSetAndLevel( pNew, pObj );
        Shr_ManAddFanout( p, Gia_ObjFaninId0p(pNew, pObj), Gia_ObjId(pNew, pObj) );
        Shr_ManAddFanout( p, Gia_ObjFaninId1p(pNew, pObj), Gia_ObjId(pNew, pObj) );
        assert( Gia_ManObjNum(pNew) < p->nNewSize );
    }
    return Bdc_FunObjCopy( Bdc_ManRoot(pManDec) );
}